

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::conditional_expression::print(conditional_expression *this,wostream *os)

{
  wostream *pwVar1;
  syntax_node *psVar2;
  wostream *os_local;
  conditional_expression *this_local;
  
  pwVar1 = std::operator<<(os,"conditional_expression{");
  psVar2 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                      (&this->cond_)->super_syntax_node;
  pwVar1 = mjs::operator<<(pwVar1,psVar2);
  pwVar1 = std::operator<<(pwVar1,", ");
  psVar2 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                      (&this->lhs_)->super_syntax_node;
  pwVar1 = mjs::operator<<(pwVar1,psVar2);
  pwVar1 = std::operator<<(pwVar1,", ");
  psVar2 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                      (&this->rhs_)->super_syntax_node;
  pwVar1 = mjs::operator<<(pwVar1,psVar2);
  std::operator<<(pwVar1,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "conditional_expression{" << *cond_ << ", " << *lhs_ << ", " << *rhs_ << "}";
    }